

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

ssize_t write_block(int fd,void *buf,size_t nbyte)

{
  long local_38;
  size_t total;
  ssize_t wr;
  size_t nbyte_local;
  void *buf_local;
  ssize_t sStack_10;
  int fd_local;
  
  local_38 = 0;
  wr = nbyte;
  nbyte_local = (size_t)buf;
  while (sStack_10 = write(fd,(void *)nbyte_local,wr), 0 < sStack_10) {
    wr = wr - sStack_10;
    nbyte_local = nbyte_local + sStack_10;
    local_38 = sStack_10 + local_38;
  }
  if (-1 < sStack_10) {
    sStack_10 = local_38;
  }
  return sStack_10;
}

Assistant:

ssize_t write_block(int fd, const void *buf, size_t nbyte) {
  ssize_t wr;
  size_t total;
  total = 0;
  while ((wr = write(fd, buf, nbyte)) > 0) {
    nbyte -= wr;
    buf = (char *)buf + wr;
    total += wr;
  }
  if (wr < 0) {
    return wr;
  } else {
    return total;
  }
}